

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O0

void __thiscall
PersistentStorageJsonTestSuite_GetDomainNotEmpty_Test::
PersistentStorageJsonTestSuite_GetDomainNotEmpty_Test
          (PersistentStorageJsonTestSuite_GetDomainNotEmpty_Test *this)

{
  PersistentStorageJsonTestSuite_GetDomainNotEmpty_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__PersistentStorageJsonTestSuite_GetDomainNotEmpty_Test_0047f298;
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, GetDomainNotEmpty)
{
    // Make test independent
    unlink("./tmp/test.tmp");

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);

    DomainId newId;

    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom1"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 0);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom2"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 1);
    EXPECT_TRUE(psj.Add(Domain{EMPTY_ID, "dom3"}, newId) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(newId.mId == 2);

    Domain returnValue;

    EXPECT_TRUE(psj.Get(DomainId(3), returnValue) == PersistentStorage::Status::kNotFound);
    EXPECT_TRUE(psj.Get(DomainId(0), returnValue) == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(returnValue.mId.mId == 0);
    EXPECT_TRUE(returnValue.mName == "dom1");

    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}